

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApprovalException.cpp
# Opt level: O3

void __thiscall
ApprovalTests::ApprovalException::ApprovalException(ApprovalException *this,string *msg)

{
  pointer pcVar1;
  
  *(undefined ***)this = &PTR__ApprovalException_0018c620;
  (this->message)._M_dataplus._M_p = (pointer)&(this->message).field_2;
  pcVar1 = (msg->_M_dataplus)._M_p;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&this->message,pcVar1,pcVar1 + msg->_M_string_length);
  return;
}

Assistant:

ApprovalException::ApprovalException(const std::string& msg) : message(msg)
    {
    }